

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

int64_t __thiscall absl::ToInt64Nanoseconds(absl *this,Duration d)

{
  uint32_t uVar1;
  int64_t iVar2;
  undefined8 extraout_RDX;
  Duration d_00;
  Duration d_01;
  Duration d_02;
  Duration lhs;
  Duration DVar3;
  Duration rhs;
  Duration d_local;
  
  d_01.rep_lo_ = (uint)d.rep_hi_;
  d_01.rep_hi_ = (int64_t)this;
  d_01._12_4_ = 0;
  iVar2 = time_internal::GetRepHi(d_01);
  if ((-1 < iVar2) &&
     (DVar3.rep_lo_ = d_01.rep_lo_, DVar3.rep_hi_ = (int64_t)this, DVar3._12_4_ = 0,
     iVar2 = time_internal::GetRepHi(DVar3), iVar2 >> 0x21 == 0)) {
    d_02.rep_lo_ = d_01.rep_lo_;
    d_02.rep_hi_ = (int64_t)this;
    d_02._12_4_ = 0;
    iVar2 = time_internal::GetRepHi(d_02);
    d_00._8_8_ = extraout_RDX;
    d_00.rep_hi_ = (ulong)d_01.rep_lo_;
    uVar1 = time_internal::GetRepLo((time_internal *)this,d_00);
    return iVar2 * 1000000000 + (ulong)uVar1 / 4;
  }
  DVar3 = Nanoseconds<int,_0>(1);
  lhs.rep_lo_ = d_01.rep_lo_;
  lhs.rep_hi_ = (int64_t)this;
  lhs._12_4_ = 0;
  rhs._12_4_ = 0;
  rhs.rep_hi_ = SUB128(DVar3._0_12_,0);
  rhs.rep_lo_ = SUB124(DVar3._0_12_,8);
  iVar2 = operator/(lhs,rhs);
  return iVar2;
}

Assistant:

int64_t ToInt64Nanoseconds(Duration d) {
  if (time_internal::GetRepHi(d) >= 0 &&
      time_internal::GetRepHi(d) >> 33 == 0) {
    return (time_internal::GetRepHi(d) * 1000 * 1000 * 1000) +
           (time_internal::GetRepLo(d) / kTicksPerNanosecond);
  }
  return d / Nanoseconds(1);
}